

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

_Bool h2_non_field(char *name,size_t namelen)

{
  int iVar1;
  ulong local_28;
  size_t i;
  size_t namelen_local;
  char *name_local;
  
  local_28 = 0;
  while( true ) {
    if (5 < local_28) {
      return false;
    }
    if (namelen < H2_NON_FIELD[local_28].namelen) break;
    if ((namelen == H2_NON_FIELD[local_28].namelen) &&
       (iVar1 = curl_strequal(H2_NON_FIELD[local_28].name,name), iVar1 != 0)) {
      return true;
    }
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

static bool h2_non_field(const char *name, size_t namelen)
{
  size_t i;
  for(i = 0; i < sizeof(H2_NON_FIELD)/sizeof(H2_NON_FIELD[0]); ++i) {
    if(namelen < H2_NON_FIELD[i].namelen)
      return FALSE;
    if(namelen == H2_NON_FIELD[i].namelen &&
       strcasecompare(H2_NON_FIELD[i].name, name))
      return TRUE;
  }
  return FALSE;
}